

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationX.hpp
# Opt level: O1

bool __thiscall
qclab::qgates::CRotationX<std::complex<double>_>::equals
          (CRotationX<std::complex<double>_> *this,QObject<std::complex<double>_> *other)

{
  rotation_type *prVar1;
  double *pdVar2;
  double dVar3;
  RotationX<std::complex<double>_> *pRVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  
  plVar8 = (long *)__dynamic_cast(other,&QObject<std::complex<double>>::typeinfo,
                                  &CRotationX<std::complex<double>>::typeinfo,0);
  if (plVar8 != (long *)0x0) {
    pRVar4 = (this->gate_)._M_t.
             super___uniq_ptr_impl<qclab::qgates::RotationX<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::RotationX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::RotationX<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::RotationX<std::complex<double>_>_*,_false>.
             _M_head_impl;
    dVar3 = *(double *)(plVar8[2] + 0x10);
    prVar1 = &(pRVar4->super_QRotationGate1<std::complex<double>_>).rotation_;
    if ((dVar3 == (prVar1->angle_).cos_) && (!NAN(dVar3) && !NAN((prVar1->angle_).cos_))) {
      dVar3 = *(double *)(plVar8[2] + 0x18);
      pdVar2 = &(pRVar4->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
      if ((dVar3 == *pdVar2) &&
         ((!NAN(dVar3) && !NAN(*pdVar2) &&
          (*(int *)((long)plVar8 + 0xc) ==
           (this->super_QControlledGate2<std::complex<double>_>).controlState_)))) {
        lVar5 = plVar8[1];
        iVar6 = (**(code **)(*plVar8 + 0x78))(plVar8);
        if (((int)lVar5 < iVar6) &&
           (iVar6 = (this->super_QControlledGate2<std::complex<double>_>).control_,
           iVar7 = (*(this->super_QControlledGate2<std::complex<double>_>).
                     super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                     _vptr_QObject[0xf])(this), iVar6 < iVar7)) {
          return true;
        }
        lVar5 = plVar8[1];
        iVar6 = (**(code **)(*plVar8 + 0x78))(plVar8);
        if (iVar6 < (int)lVar5) {
          iVar6 = (this->super_QControlledGate2<std::complex<double>_>).control_;
          iVar7 = (*(this->super_QControlledGate2<std::complex<double>_>).
                    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject[0xf])(this);
          return iVar7 < iVar6;
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CRX = CRotationX< T > ;
          if ( const CRX* p = dynamic_cast< const CRX* >( &other ) ) {
            if ( p->rotation() != this->rotation() ) return false ;
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }